

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

string * __thiscall
protozero::HeapBuffered<perfetto::protos::pbzero::TrackDescriptor>::SerializeAsString_abi_cxx11_
          (string *__return_storage_ptr__,
          HeapBuffered<perfetto::protos::pbzero::TrackDescriptor> *this)

{
  uchar *puVar1;
  size_type sVar2;
  allocator local_31;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> vec;
  HeapBuffered<perfetto::protos::pbzero::TrackDescriptor> *this_local;
  
  vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  SerializeAsArray((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,this);
  puVar1 = perfetto::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  sVar2 = perfetto::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)puVar1,sVar2,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  perfetto::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string SerializeAsString() {
    auto vec = SerializeAsArray();
    return std::string(reinterpret_cast<const char*>(vec.data()), vec.size());
  }